

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O0

void __thiscall fmcalc::init_programme(fmcalc *this,int maxRunLevel)

{
  FILE *__stream;
  int iVar1;
  value_type vVar2;
  int iVar3;
  long lVar4;
  char *__filename;
  FILE *__stream_00;
  undefined8 uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference this_00;
  value_type_conflict local_b4;
  size_t local_b0;
  size_t i;
  int local_a0;
  fm_programme f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [55];
  allocator local_41;
  string local_40 [8];
  string file;
  FILE *fin;
  int maxRunLevel_local;
  fmcalc *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"input/fm_programme.bin",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  lVar4 = std::__cxx11::string::length();
  if (lVar4 != 0) {
    std::__cxx11::string::substr((ulong)&f.level_id,(ulong)local_40);
    std::operator+(local_78,&this->inputpath_);
    std::__cxx11::string::operator=(local_40,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&f.level_id);
  }
  __filename = (char *)std::__cxx11::string::c_str();
  __stream_00 = fopen(__filename,"rb");
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    uVar5 = std::__cxx11::string::c_str();
    fprintf(__stream,"FATAL: %s: cannot open %s\n","init_programme",uVar5);
    exit(1);
  }
  if (maxRunLevel != -1) {
    this->maxRunLevel_ = maxRunLevel;
  }
  sVar6 = std::vector<int,_std::allocator<int>_>::size(&this->level_to_maxagg_id_);
  if (sVar6 == 0) {
    i._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->level_to_maxagg_id_,1,(value_type_conflict *)&i);
  }
  local_b0 = fread((void *)((long)&i + 4),0xc,1,__stream_00);
  while (local_b0 != 0) {
    if (local_a0 <= this->maxRunLevel_) {
      if (this->maxLevel_ < local_a0) {
        this->maxLevel_ = local_a0;
        local_b4 = -1;
        std::vector<int,_std::allocator<int>_>::resize
                  (&this->level_to_maxagg_id_,(long)(this->maxLevel_ + 1),&local_b4);
      }
      iVar1 = i._4_4_;
      if (local_a0 == 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->level_to_maxagg_id_,0);
        vVar2 = i._4_4_;
        if (*pvVar7 < iVar1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->level_to_maxagg_id_,0);
          *pvVar7 = vVar2;
        }
        sVar6 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::size(&this->pfm_vec_vec_);
        if (sVar6 == 0) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(&this->pfm_vec_vec_,1);
        }
        pvVar8 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->pfm_vec_vec_,0);
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar8);
        if (sVar6 < (long)i._4_4_ + 1U) {
          pvVar8 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&this->pfm_vec_vec_,0);
          std::vector<int,_std::allocator<int>_>::resize(pvVar8,(long)(i._4_4_ + 1));
        }
        vVar2 = i._4_4_;
        pvVar8 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->pfm_vec_vec_,0);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)i._4_4_);
        *pvVar7 = vVar2;
      }
      iVar1 = f.from_agg_id;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->level_to_maxagg_id_,(long)local_a0);
      iVar3 = f.from_agg_id;
      if (*pvVar7 < iVar1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->level_to_maxagg_id_,(long)local_a0);
        *pvVar7 = iVar3;
      }
      sVar6 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(&this->pfm_vec_vec_);
      if (sVar6 < (long)local_a0 + 1U) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::resize(&this->pfm_vec_vec_,(long)(local_a0 + 1));
      }
      pvVar8 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->pfm_vec_vec_,(long)local_a0);
      sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar8);
      if (sVar6 < (long)i._4_4_ + 1U) {
        pvVar8 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->pfm_vec_vec_,(long)local_a0);
        std::vector<int,_std::allocator<int>_>::resize(pvVar8,(long)(i._4_4_ + 1));
      }
      iVar1 = f.from_agg_id;
      pvVar8 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->pfm_vec_vec_,(long)local_a0);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)i._4_4_);
      *pvVar7 = iVar1;
      if (f.from_agg_id == 0) {
        fprintf(_stderr,"FATAL: Invalid agg id from fm_programme.bin\n");
      }
      sVar6 = std::
              vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
              ::size(&this->node_to_direct_sub_nodes_vec_);
      if (sVar6 < (long)local_a0 + 1U) {
        std::
        vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
        ::resize(&this->node_to_direct_sub_nodes_vec_,(long)(local_a0 + 1));
        std::
        vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
        ::resize(&this->node_to_coverage_ids_,(long)(local_a0 + 1));
      }
      pvVar9 = std::
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               ::operator[](&this->node_to_direct_sub_nodes_vec_,(long)local_a0);
      sVar6 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(pvVar9);
      if (sVar6 < (long)f.from_agg_id + 1U) {
        pvVar9 = std::
                 vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                 ::operator[](&this->node_to_direct_sub_nodes_vec_,(long)local_a0);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::resize(pvVar9,(long)(f.from_agg_id + 1));
        this_00 = std::
                  vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                  ::operator[](&this->node_to_coverage_ids_,(long)local_a0);
        std::
        vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ::resize(this_00,(long)(f.from_agg_id + 1));
      }
      pvVar9 = std::
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               ::operator[](&this->node_to_direct_sub_nodes_vec_,(long)local_a0);
      pvVar8 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](pvVar9,(long)f.from_agg_id);
      std::vector<int,_std::allocator<int>_>::push_back
                (pvVar8,(value_type_conflict *)((long)&i + 4));
    }
    local_b0 = fread((void *)((long)&i + 4),0xc,1,__stream_00);
  }
  fclose(__stream_00);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void fmcalc::init_programme(int maxRunLevel)
{

	FILE *fin = NULL;
	std::string file = FMPROGRAMME_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL){
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	fm_programme f;
    if (maxRunLevel != -1) maxRunLevel_ = maxRunLevel;

	if (level_to_maxagg_id_.size() == 0) {
		level_to_maxagg_id_.resize(1, -1);
	}
	size_t i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {
        if (f.level_id <= maxRunLevel_){
			if (maxLevel_ < f.level_id) {
				maxLevel_ = f.level_id;
				level_to_maxagg_id_.resize(maxLevel_ + 1, -1);
			}
			if (f.level_id == 1) {	
				if (f.from_agg_id > level_to_maxagg_id_[0])level_to_maxagg_id_[0] = f.from_agg_id;
				if (pfm_vec_vec_.size() < 1) {
					pfm_vec_vec_.resize(1);
				}
				if (pfm_vec_vec_[0].size() < (size_t)f.from_agg_id + 1) {
					pfm_vec_vec_[0].resize(f.from_agg_id + 1);
				}
				pfm_vec_vec_[0][f.from_agg_id] = f.from_agg_id;
			}					
			if (f.to_agg_id > level_to_maxagg_id_[f.level_id])level_to_maxagg_id_[f.level_id] = f.to_agg_id;
            if (pfm_vec_vec_.size() < (size_t)f.level_id + 1) {
                pfm_vec_vec_.resize(f.level_id + 1);
            }
            if (pfm_vec_vec_[f.level_id].size() < (size_t)f.from_agg_id + 1) {
                pfm_vec_vec_[f.level_id].resize(f.from_agg_id + 1);
            }
            pfm_vec_vec_[f.level_id][f.from_agg_id] = f.to_agg_id;
            if (f.to_agg_id == 0) {
                fprintf(stderr, "FATAL: Invalid agg id from fm_programme.bin\n");
            }

	    // Fill node_to_direct_sub_nodes_vec_[level_id][to_agg_id] = vector<int>(from_agg_id)
	    if (node_to_direct_sub_nodes_vec_.size() < (size_t)f.level_id + 1) {
		node_to_direct_sub_nodes_vec_.resize(f.level_id + 1);
		node_to_coverage_ids_.resize(f.level_id + 1);
	    }
	    if (node_to_direct_sub_nodes_vec_[f.level_id].size() < (size_t)f.to_agg_id + 1) {
		node_to_direct_sub_nodes_vec_[f.level_id].resize(f.to_agg_id + 1);
		node_to_coverage_ids_[f.level_id].resize(f.to_agg_id + 1);
	    }
	    node_to_direct_sub_nodes_vec_[f.level_id][f.to_agg_id].push_back(f.from_agg_id);
        }
		i = fread(&f, sizeof(f), 1, fin);
	}
	fclose(fin);

}